

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O2

void __thiscall
anurbs::Entry<anurbs::BrepFace>::Entry
          (Entry<anurbs::BrepFace> *this,string *key,shared_ptr<anurbs::BrepFace> *data,
          shared_ptr<anurbs::Attributes> *attributes)

{
  (this->super_EntryBase)._vptr_EntryBase = (_func_int **)&PTR_key_abi_cxx11__0038ea70;
  std::__cxx11::string::string((string *)&this->m_key,(string *)key);
  std::__shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_data).super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>,
             &data->super___shared_ptr<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_attributes).
              super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>,
             &attributes->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

Entry(const std::string& key, std::shared_ptr<TData> data,
        std::shared_ptr<Attributes> attributes)
        : m_key(key), m_data(data), m_attributes(attributes)
    {
    }